

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

int xmlDebugCheckDocument(FILE *output,xmlDocPtr doc)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_a8;
  
  if (output == (FILE *)0x0) {
    output = _stdout;
  }
  local_a8.depth = 0;
  local_a8.doc = (xmlDocPtr)0x0;
  local_a8.node = (xmlNodePtr)0x0;
  local_a8.dict = (xmlDictPtr)0x0;
  builtin_strncpy(local_a8.shift,
                  "                                                                                                    "
                  ,0x65);
  local_a8.check = 1;
  local_a8.errors = 0;
  local_a8.nodict = 0;
  local_a8.options = 0;
  local_a8.output = output;
  xmlCtxtDumpDocument(&local_a8,doc);
  return local_a8.errors;
}

Assistant:

int
xmlDebugCheckDocument(FILE * output, xmlDocPtr doc)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.check = 1;
    xmlCtxtDumpDocument(&ctxt, doc);
    xmlCtxtDumpCleanCtxt(&ctxt);
    return(ctxt.errors);
}